

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoprism.h
# Opt level: O0

void pzgeom::TPZGeoPrism::GradX<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *gradx)

{
  Fad<double> *this;
  long *in_RDX;
  TPZBaseMatrix *in_RDI;
  Fad<double> *extraout_XMM0_Qa;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *extraout_XMM0_Qa_00;
  int64_t col;
  int j;
  int i;
  TPZFNMatrix<18,_Fad<double>_> dphi;
  TPZFNMatrix<6,_Fad<double>_> phi;
  int ncol;
  int nrow;
  Fad<double> *in_stack_fffffffffffffab0;
  int64_t in_stack_fffffffffffffac0;
  Fad<double> *in_stack_fffffffffffffac8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffad0;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffffad8;
  Fad<double> *e;
  double a;
  int64_t col_00;
  int64_t in_stack_fffffffffffffb08;
  TPZFNMatrix<18,_Fad<double>_> *in_stack_fffffffffffffb10;
  int local_494;
  int local_490;
  
  a = 1.48219693752374e-323;
  (**(code **)(*in_RDX + 0x68))(in_RDX,3);
  (**(code **)(*in_RDX + 0x78))();
  TPZBaseMatrix::Rows(in_RDI);
  TPZBaseMatrix::Cols(in_RDI);
  col_00 = 6;
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<6,_Fad<double>_> *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,6);
  TPZFNMatrix<18,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,col_00);
  pztopology::TPZPrism::TShape<Fad<double>>
            ((TPZVec<Fad<double>_> *)dphi.fBuf[0].dx_._0_8_,
             (TPZFMatrix<Fad<double>_> *)dphi.fBuf[0].val_,
             (TPZFMatrix<Fad<double>_> *)dphi.super_TPZFMatrix<Fad<double>_>.fWork.fNAlloc);
  for (local_490 = 0; local_490 < 6; local_490 = local_490 + 1) {
    for (local_494 = 0; local_494 < 3; local_494 = local_494 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_494,(long)local_490);
      e = extraout_XMM0_Qa;
      TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffffad0,(int64_t)in_stack_fffffffffffffac8,
                 in_stack_fffffffffffffac0);
      operator*<double,_Fad<double>,_nullptr>(a,e);
      this = TPZFMatrix<Fad<double>_>::operator()
                       (in_stack_fffffffffffffad0,(int64_t)in_stack_fffffffffffffac8,
                        in_stack_fffffffffffffac0);
      Fad<double>::operator+=(this,in_stack_fffffffffffffad8);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffab0);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_494,(long)local_490);
      in_stack_fffffffffffffad8 = extraout_XMM0_Qa_00;
      in_stack_fffffffffffffad0 =
           (TPZFMatrix<Fad<double>_> *)
           TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffffad0,(int64_t)in_stack_fffffffffffffac8,
                      in_stack_fffffffffffffac0);
      operator*<double,_Fad<double>,_nullptr>(a,e);
      in_stack_fffffffffffffac8 =
           TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffffad0,(int64_t)in_stack_fffffffffffffac8,
                      in_stack_fffffffffffffac0);
      Fad<double>::operator+=(this,in_stack_fffffffffffffad8);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffab0);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_494,(long)local_490);
      in_stack_fffffffffffffac0 = col;
      TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffffad0,(int64_t)in_stack_fffffffffffffac8,col);
      operator*<double,_Fad<double>,_nullptr>(a,e);
      in_stack_fffffffffffffab0 =
           TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffffad0,(int64_t)in_stack_fffffffffffffac8,
                      in_stack_fffffffffffffac0);
      Fad<double>::operator+=(this,in_stack_fffffffffffffad8);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffab0);
    }
  }
  TPZFNMatrix<18,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<18,_Fad<double>_> *)0x162765f);
  TPZFNMatrix<6,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<6,_Fad<double>_> *)0x162766c);
  return;
}

Assistant:

inline void TPZGeoPrism::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        gradx.Resize(3,3);
        gradx.Zero();
        int nrow = nodes.Rows();
        int ncol = nodes.Cols();
#ifdef PZDEBUG
        if(nrow != 3 || ncol  != 6){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be 3x6." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<6,T> phi(6,1);
        TPZFNMatrix<18,T> dphi(3,6);
        TShape(loc,phi,dphi);
        for(int i = 0; i < 6; i++)
        {
            for(int j = 0; j < 3; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
                gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            }
        }
        
    }